

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strFindFirst_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  long lVar1;
  UBool UVar2;
  UChar UVar3;
  UChar *t;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar UVar6;
  UChar *pUVar7;
  long lVar8;
  UChar *pUVar9;
  UChar UVar10;
  int iVar11;
  long lVar12;
  
  if (subLength < -1 || sub == (UChar *)0x0) {
    return s;
  }
  if (-2 < length && s != (UChar *)0x0) {
    if ((subLength & length) < 0) {
      UVar6 = *sub;
      if (UVar6 == L'\0') {
        return s;
      }
      UVar3 = sub[1];
      if ((UVar6 & 0xf800U) != 0xd800 && UVar3 == L'\0') goto LAB_00377273;
      UVar10 = *s;
      if (UVar10 != L'\0') {
        pUVar4 = s;
        do {
          pUVar7 = pUVar4 + 1;
          if (UVar10 == UVar6) {
            pUVar5 = pUVar7;
            if (UVar3 != L'\0') {
              lVar12 = 2;
              UVar10 = UVar3;
              do {
                if (*(UChar *)((long)pUVar4 + lVar12) == L'\0') {
                  return (UChar *)0x0;
                }
                if (*(UChar *)((long)pUVar4 + lVar12) != UVar10) goto LAB_0037723c;
                UVar10 = *(UChar *)((long)sub + lVar12 + 2);
                lVar12 = lVar12 + 2;
              } while (UVar10 != L'\0');
              pUVar5 = (UChar *)(lVar12 + (long)pUVar4);
            }
            if ((pUVar4 == s || (UVar6 & 0xfc00U) != 0xdc00) || ((pUVar4[-1] & 0xfc00U) != 0xd800))
            {
              if ((pUVar5[-1] & 0xfc00U) != 0xd800) {
                return pUVar4;
              }
              if ((*pUVar5 & 0xfc00U) != 0xdc00) {
                return pUVar4;
              }
            }
          }
LAB_0037723c:
          UVar10 = *pUVar7;
          pUVar4 = pUVar7;
          if (UVar10 == L'\0') {
            return (UChar *)0x0;
          }
        } while( true );
      }
    }
    else {
      if (subLength < 0) {
        subLength = -1;
        pUVar4 = sub;
        do {
          subLength = subLength + 1;
          UVar6 = *pUVar4;
          pUVar4 = pUVar4 + 1;
        } while (UVar6 != L'\0');
      }
      if (subLength == 0) {
        return s;
      }
      UVar6 = *sub;
      iVar11 = subLength + -1;
      if ((UVar6 & 0xf800U) != 0xd800 && iVar11 == 0) {
        if (-1 < length) {
          pUVar4 = u_memchr_63(s,UVar6,length);
          return pUVar4;
        }
LAB_00377273:
        pUVar4 = u_strchr_63(s,UVar6);
        return pUVar4;
      }
      lVar12 = (long)iVar11;
      if (length < 0) {
        UVar3 = *s;
        if (UVar3 != L'\0') {
          pUVar4 = s;
          do {
            pUVar7 = pUVar4 + 1;
            if (UVar3 == UVar6) {
              pUVar5 = pUVar7;
              if (iVar11 != 0) {
                lVar8 = 2;
                do {
                  if (*(short *)((long)pUVar4 + lVar8) == 0) {
                    return (UChar *)0x0;
                  }
                  if (*(short *)((long)pUVar4 + lVar8) != *(short *)((long)sub + lVar8))
                  goto LAB_00377300;
                  lVar1 = lVar8 + lVar12 * -2;
                  lVar8 = lVar8 + 2;
                } while (lVar1 != 0);
                pUVar5 = (UChar *)(lVar8 + (long)pUVar4);
              }
              UVar2 = isMatchAtCPBoundary(s,pUVar4,pUVar5,(UChar *)0x0);
              if (UVar2 != '\0') {
                return pUVar4;
              }
            }
LAB_00377300:
            UVar3 = *pUVar7;
            pUVar4 = pUVar7;
            if (UVar3 == L'\0') {
              return (UChar *)0x0;
            }
          } while( true );
        }
      }
      else if (subLength <= length) {
        pUVar4 = s + (uint)length;
        if (pUVar4 + -lVar12 != s) {
          pUVar7 = s;
          do {
            pUVar5 = pUVar7 + 1;
            if (*pUVar7 == UVar6) {
              pUVar9 = pUVar5;
              if (iVar11 != 0) {
                lVar8 = 2;
                do {
                  if (*(short *)((long)pUVar7 + lVar8) != *(short *)((long)sub + lVar8))
                  goto LAB_0037713a;
                  lVar1 = lVar8 + lVar12 * -2;
                  lVar8 = lVar8 + 2;
                } while (lVar1 != 0);
                pUVar9 = (UChar *)(lVar8 + (long)pUVar7);
              }
              if ((pUVar7 == s || (UVar6 & 0xfc00U) != 0xdc00) || ((pUVar7[-1] & 0xfc00U) != 0xd800)
                 ) {
                if (pUVar7 == pUVar4) {
                  return pUVar7;
                }
                if ((pUVar9[-1] & 0xfc00U) != 0xd800) {
                  return pUVar7;
                }
                if ((*pUVar9 & 0xfc00U) != 0xdc00) {
                  return pUVar7;
                }
              }
            }
LAB_0037713a:
            pUVar7 = pUVar5;
            if (pUVar5 == pUVar4 + -lVar12) {
              return (UChar *)0x0;
            }
          } while( true );
        }
      }
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindFirst(const UChar *s, int32_t length,
               const UChar *sub, int32_t subLength) {
    const UChar *start, *p, *q, *subLimit;
    UChar c, cs, cq;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    start=s;

    if(length<0 && subLength<0) {
        /* both strings are NUL-terminated */
        if((cs=*sub++)==0) {
            return (UChar *)s;
        }
        if(*sub==0 && !U16_IS_SURROGATE(cs)) {
            /* the substring consists of a single, non-surrogate BMP code point */
            return u_strchr(s, cs);
        }

        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if((cq=*q)==0) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=cq) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }

        /* not found */
        return NULL;
    }

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[0] to search for it fast */
    cs=*sub++;
    --subLength;
    subLimit=sub+subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strchr(s, cs) : u_memchr(s, cs, length);
    }

    if(length<0) {
        /* s is NUL-terminated */
        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    } else {
        const UChar *limit, *preLimit;

        /* subLength was decremented above */
        if(length<=subLength) {
            return NULL; /* s is shorter than sub */
        }

        limit=s+length;

        /* the substring must start before preLimit */
        preLimit=limit-subLength;

        while(s!=preLimit) {
            c=*s++;
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, limit)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if(*p!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    }

    /* not found */
    return NULL;
}